

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O2

void Abc_FlowRetime_ConstrainExact(Abc_Obj_t *pObj)

{
  Vec_Ptr_t *vNodes;
  long lVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  Flow_Data_t *pFVar5;
  long *plVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  
  if ((undefined1  [24])
      ((undefined1  [24])pManMR->pDataArray[(uint)pObj->Id] & (undefined1  [24])0x80) !=
      (undefined1  [24])0x0) {
    pFVar5 = pManMR->pDataArray + (uint)pObj->Id;
    pManMR->nConservConstraints = pManMR->nConservConstraints + -1;
    *(byte *)pFVar5 = *(byte *)pFVar5 & 0x7f;
  }
  vNodes = pManMR->vNodes;
  if (pManMR->fIsForward == 0) {
    if (vNodes->nSize != 0) {
      __assert_fail("!Vec_PtrSize( vNodes )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                    ,0x215,"void Abc_FlowRetime_ConstrainExact_back(Abc_Obj_t *)");
    }
    if ((*(uint *)&pObj->field_0x14 & 0xf) == 8) {
      __assert_fail("!Abc_ObjIsLatch(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                    ,0x216,"void Abc_FlowRetime_ConstrainExact_back(Abc_Obj_t *)");
    }
    if (pManMR->vTimeEdges[(uint)pObj->Id].nSize != 0) {
      __assert_fail("!Vec_PtrSize( FTIMEEDGES(pObj) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                    ,0x217,"void Abc_FlowRetime_ConstrainExact_back(Abc_Obj_t *)");
    }
    Vec_PtrPush(pManMR->vExactNodes,pObj);
    Abc_FlowRetime_ConstrainExact_back_rec(pObj,vNodes,0);
    iVar7 = vNodes->nSize;
    while (0 < iVar7) {
      iVar7 = iVar7 + -1;
      plVar3 = (long *)Vec_PtrEntry(vNodes,iVar7);
      plVar6 = (long *)((ulong)plVar3 & 0xfffffffffffffffe);
      if (plVar3 == plVar6) {
        if ((*(uint *)((long)plVar6 + 0x14) & 0xf) == 8) {
          __assert_fail("!Abc_ObjIsLatch(pReg)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                        ,0x221,"void Abc_FlowRetime_ConstrainExact_back(Abc_Obj_t *)");
        }
        for (lVar4 = 0; lVar4 < *(int *)((long)plVar6 + 0x2c); lVar4 = lVar4 + 1) {
          lVar1 = *(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                           (long)*(int *)(plVar6[6] + lVar4 * 4) * 8);
          uVar2 = *(uint *)(lVar1 + 0x14);
          uVar8 = uVar2 >> 0xc;
          uVar9 = (uint)((*(uint *)((long)plVar6 + 0x14) & 0xf) == 7) +
                  (*(uint *)((long)plVar6 + 0x14) >> 0xc);
          if (uVar8 <= uVar9) {
            uVar8 = uVar9;
          }
          *(uint *)(lVar1 + 0x14) = uVar2 & 0xfff | uVar8 << 0xc;
        }
        if (pManMR->maxDelay < (int)(*(uint *)((long)plVar6 + 0x14) >> 0xc)) {
          __assert_fail("(int)pReg->Level <= pManMR->maxDelay",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                        ,0x224,"void Abc_FlowRetime_ConstrainExact_back(Abc_Obj_t *)");
        }
        *(uint *)((long)plVar6 + 0x14) = *(uint *)((long)plVar6 + 0x14) & 0xfcf;
      }
    }
    iVar7 = vNodes->nSize;
    while (0 < iVar7) {
      iVar7 = iVar7 + -1;
      plVar3 = (long *)Vec_PtrEntry(vNodes,iVar7);
      plVar6 = (long *)((ulong)plVar3 & 0xfffffffffffffffe);
      if (plVar3 != plVar6) {
        for (lVar4 = 0; lVar4 < *(int *)((long)plVar6 + 0x2c); lVar4 = lVar4 + 1) {
          lVar1 = *(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                           (long)*(int *)(plVar6[6] + lVar4 * 4) * 8);
          uVar2 = *(uint *)(lVar1 + 0x14);
          if ((uVar2 & 0xf) != 8) {
            uVar9 = (uint)((*(uint *)((long)plVar6 + 0x14) & 0xf) == 7) +
                    (*(uint *)((long)plVar6 + 0x14) >> 0xc);
            uVar8 = uVar2 >> 0xc;
            if (uVar2 >> 0xc <= uVar9) {
              uVar8 = uVar9;
            }
            *(uint *)(lVar1 + 0x14) = uVar2 & 0xfff | uVar8 << 0xc;
          }
        }
        uVar2 = *(uint *)((long)plVar6 + 0x14);
        if (uVar2 >> 0xc == pManMR->maxDelay) {
          Vec_PtrPush(pManMR->vTimeEdges + (uint)pObj->Id,plVar6);
          pManMR->nExactConstraints = pManMR->nExactConstraints + 1;
          uVar2 = *(uint *)((long)plVar6 + 0x14);
        }
        *(uint *)((long)plVar6 + 0x14) = uVar2 & 0xfcf;
      }
    }
  }
  else {
    if (vNodes->nSize != 0) {
      __assert_fail("!Vec_PtrSize(vNodes)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                    ,0x1ca,"void Abc_FlowRetime_ConstrainExact_forw(Abc_Obj_t *)");
    }
    if ((*(uint *)&pObj->field_0x14 & 0xf) == 8) {
      __assert_fail("!Abc_ObjIsLatch(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                    ,0x1cb,"void Abc_FlowRetime_ConstrainExact_forw(Abc_Obj_t *)");
    }
    if (pManMR->vTimeEdges[(uint)pObj->Id].nSize != 0) {
      __assert_fail("!Vec_PtrSize( FTIMEEDGES(pObj) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                    ,0x1cc,"void Abc_FlowRetime_ConstrainExact_forw(Abc_Obj_t *)");
    }
    Vec_PtrPush(pManMR->vExactNodes,pObj);
    Abc_FlowRetime_ConstrainExact_forw_rec(pObj,vNodes,0);
    iVar7 = vNodes->nSize;
    while (0 < iVar7) {
      iVar7 = iVar7 + -1;
      plVar3 = (long *)Vec_PtrEntry(vNodes,iVar7);
      plVar6 = (long *)((ulong)plVar3 & 0xfffffffffffffffe);
      if (plVar3 == plVar6) {
        if ((*(uint *)((long)plVar6 + 0x14) & 0xf) == 8) {
          __assert_fail("!Abc_ObjIsLatch(pReg)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                        ,0x1d6,"void Abc_FlowRetime_ConstrainExact_forw(Abc_Obj_t *)");
        }
        for (lVar4 = 0; lVar4 < *(int *)((long)plVar6 + 0x1c); lVar4 = lVar4 + 1) {
          lVar1 = *(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                           (long)*(int *)(plVar6[4] + lVar4 * 4) * 8);
          uVar2 = *(uint *)(lVar1 + 0x14);
          uVar8 = uVar2 >> 0xc;
          uVar9 = (uint)((*(uint *)((long)plVar6 + 0x14) & 0xf) == 7) +
                  (*(uint *)((long)plVar6 + 0x14) >> 0xc);
          if (uVar8 <= uVar9) {
            uVar8 = uVar9;
          }
          *(uint *)(lVar1 + 0x14) = uVar2 & 0xfff | uVar8 << 0xc;
        }
        if (pManMR->maxDelay < (int)(*(uint *)((long)plVar6 + 0x14) >> 0xc)) {
          __assert_fail("(int)pReg->Level <= pManMR->maxDelay",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                        ,0x1d9,"void Abc_FlowRetime_ConstrainExact_forw(Abc_Obj_t *)");
        }
        *(uint *)((long)plVar6 + 0x14) = *(uint *)((long)plVar6 + 0x14) & 0xfcf;
      }
    }
    iVar7 = vNodes->nSize;
    while (0 < iVar7) {
      iVar7 = iVar7 + -1;
      plVar3 = (long *)Vec_PtrEntry(vNodes,iVar7);
      plVar6 = (long *)((ulong)plVar3 & 0xfffffffffffffffe);
      if (plVar3 != plVar6) {
        for (lVar4 = 0; lVar4 < *(int *)((long)plVar6 + 0x1c); lVar4 = lVar4 + 1) {
          lVar1 = *(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                           (long)*(int *)(plVar6[4] + lVar4 * 4) * 8);
          uVar2 = *(uint *)(lVar1 + 0x14);
          if ((uVar2 & 0xf) != 8) {
            uVar9 = (uint)((*(uint *)((long)plVar6 + 0x14) & 0xf) == 7) +
                    (*(uint *)((long)plVar6 + 0x14) >> 0xc);
            uVar8 = uVar2 >> 0xc;
            if (uVar2 >> 0xc <= uVar9) {
              uVar8 = uVar9;
            }
            *(uint *)(lVar1 + 0x14) = uVar2 & 0xfff | uVar8 << 0xc;
          }
        }
        uVar2 = *(uint *)((long)plVar6 + 0x14);
        if (uVar2 >> 0xc == pManMR->maxDelay) {
          Vec_PtrPush(pManMR->vTimeEdges + (uint)pObj->Id,plVar6);
          pManMR->nExactConstraints = pManMR->nExactConstraints + 1;
          uVar2 = *(uint *)((long)plVar6 + 0x14);
        }
        *(uint *)((long)plVar6 + 0x14) = uVar2 & 0xfcf;
      }
    }
  }
  vNodes->nSize = 0;
  return;
}

Assistant:

void Abc_FlowRetime_ConstrainExact( Abc_Obj_t * pObj ) {

  if (FTEST( pObj, CONSERVATIVE )) {
    pManMR->nConservConstraints--;
    FUNSET( pObj, CONSERVATIVE );
  }

#if !defined(IGNORE_TIMING)
  if (pManMR->fIsForward) {
    Abc_FlowRetime_ConstrainExact_forw(pObj);
  } else {
    Abc_FlowRetime_ConstrainExact_back(pObj);
  }
#endif
}